

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreeCheckMapping(RtreeCheck *pCheck,int bLeaf,i64 iKey,i64 iVal)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  Mem *pMem;
  i64 iVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)bLeaf;
  if (pCheck->aCheckMapping[uVar5] == (sqlite3_stmt *)0x0) {
    psVar2 = rtreeCheckPrepare(pCheck,&DAT_001defa4 + *(int *)(&DAT_001defa4 + uVar5 * 4),
                               pCheck->zDb,pCheck->zTab);
    pCheck->aCheckMapping[uVar5] = psVar2;
  }
  if (pCheck->rc == 0) {
    psVar2 = pCheck->aCheckMapping[uVar5];
    sqlite3_bind_int64(psVar2,1,iKey);
    iVar1 = sqlite3_step(psVar2);
    if (iVar1 == 100) {
      pMem = columnMem(psVar2,0);
      iVar3 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure(psVar2);
      if (iVar3 != iVal) {
        pcVar4 = "%_rowid";
        if (bLeaf == 0) {
          pcVar4 = "%_parent";
        }
        rtreeCheckAppendMsg(pCheck,"Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",iKey,
                            iVar3,pcVar4,iKey,iVal);
      }
    }
    else if (iVar1 == 0x65) {
      pcVar4 = "%_rowid";
      if (bLeaf == 0) {
        pcVar4 = "%_parent";
      }
      rtreeCheckAppendMsg(pCheck,"Mapping (%lld -> %lld) missing from %s table",iKey,iVal,pcVar4);
    }
    iVar1 = sqlite3_reset(psVar2);
    if (pCheck->rc == 0) {
      pCheck->rc = iVar1;
    }
  }
  return;
}

Assistant:

static void rtreeCheckMapping(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  int bLeaf,                      /* True for a leaf cell, false for interior */
  i64 iKey,                       /* Key for mapping */
  i64 iVal                        /* Expected value for mapping */
){
  int rc;
  sqlite3_stmt *pStmt;
  const char *azSql[2] = {
    "SELECT parentnode FROM %Q.'%q_parent' WHERE nodeno=?1",
    "SELECT nodeno FROM %Q.'%q_rowid' WHERE rowid=?1"
  };

  assert( bLeaf==0 || bLeaf==1 );
  if( pCheck->aCheckMapping[bLeaf]==0 ){
    pCheck->aCheckMapping[bLeaf] = rtreeCheckPrepare(pCheck,
        azSql[bLeaf], pCheck->zDb, pCheck->zTab
    );
  }
  if( pCheck->rc!=SQLITE_OK ) return;

  pStmt = pCheck->aCheckMapping[bLeaf];
  sqlite3_bind_int64(pStmt, 1, iKey);
  rc = sqlite3_step(pStmt);
  if( rc==SQLITE_DONE ){
    rtreeCheckAppendMsg(pCheck, "Mapping (%lld -> %lld) missing from %s table",
        iKey, iVal, (bLeaf ? "%_rowid" : "%_parent")
    );
  }else if( rc==SQLITE_ROW ){
    i64 ii = sqlite3_column_int64(pStmt, 0);
    if( ii!=iVal ){
      rtreeCheckAppendMsg(pCheck, 
          "Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",
          iKey, ii, (bLeaf ? "%_rowid" : "%_parent"), iKey, iVal
      );
    }
  }
  rtreeCheckReset(pCheck, pStmt);
}